

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::CreateAddress(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::CreateAddressResponseStruct_(const_cfd::js::api::CreateAddressRequestStruct_&)>
  local_58;
  function<cfd::js::api::CreateAddressResponseStruct_(const_cfd::js::api::CreateAddressRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::CreateAddressResponseStruct(cfd::js::api::CreateAddressRequestStruct_const&)>
  ::
  function<cfd::js::api::CreateAddressResponseStruct(&)(cfd::js::api::CreateAddressRequestStruct_const&),void>
            ((function<cfd::js::api::CreateAddressResponseStruct(cfd::js::api::CreateAddressRequestStruct_const&)>
              *)&local_38,AddressStructApi::CreateAddress);
  std::
  function<cfd::js::api::CreateAddressResponseStruct(cfd::js::api::CreateAddressRequestStruct_const&)>
  ::
  function<cfd::js::api::CreateAddressResponseStruct(&)(cfd::js::api::CreateAddressRequestStruct_const&),void>
            ((function<cfd::js::api::CreateAddressResponseStruct(cfd::js::api::CreateAddressRequestStruct_const&)>
              *)&local_58,ElementsAddressStructApi::CreateAddress);
  ExecuteElementsCheckApi<cfd::js::api::json::CreateAddressRequest,cfd::js::api::json::CreateAddressResponse,cfd::js::api::CreateAddressRequestStruct,cfd::js::api::CreateAddressResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::CreateAddressResponseStruct_(const_cfd::js::api::CreateAddressRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::CreateAddressResponseStruct_(const_cfd::js::api::CreateAddressRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::CreateAddress(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::CreateAddressRequest, api::json::CreateAddressResponse,
      api::CreateAddressRequestStruct, api::CreateAddressResponseStruct>(
      request_message, AddressStructApi::CreateAddress,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressStructApi::CreateAddress);
#else
      AddressStructApi::CreateAddress);
#endif
}